

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int decode_jpeg_header(jpeg *z,int scan)

{
  uint8 uVar1;
  byte bVar2;
  int iVar3;
  uint local_20;
  int m;
  int scan_local;
  jpeg *z_local;
  
  z->marker = 0xff;
  uVar1 = get_marker(z);
  if (uVar1 == 0xd8) {
    if (scan == 1) {
      z_local._4_4_ = 1;
    }
    else {
      bVar2 = get_marker(z);
      local_20 = (uint)bVar2;
      while (local_20 != 0xc0 && local_20 != 0xc1) {
        iVar3 = process_marker(z,local_20);
        if (iVar3 == 0) {
          return 0;
        }
        bVar2 = get_marker(z);
        while (local_20 = (uint)bVar2, local_20 == 0xff) {
          iVar3 = at_eof(&z->s);
          if (iVar3 != 0) {
            iVar3 = e("Corrupt JPEG");
            return iVar3;
          }
          bVar2 = get_marker(z);
        }
      }
      iVar3 = process_frame_header(z,scan);
      if (iVar3 == 0) {
        z_local._4_4_ = 0;
      }
      else {
        z_local._4_4_ = 1;
      }
    }
  }
  else {
    z_local._4_4_ = e("Corrupt JPEG");
  }
  return z_local._4_4_;
}

Assistant:

static int decode_jpeg_header(jpeg *z, int scan)
{
   int m;
   z->marker = MARKER_none; // initialize cached marker to empty
   m = get_marker(z);
   if (!SOI(m)) return e("no SOI","Corrupt JPEG");
   if (scan == SCAN_type) return 1;
   m = get_marker(z);
   while (!SOF(m)) {
      if (!process_marker(z,m)) return 0;
      m = get_marker(z);
      while (m == MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (at_eof(&z->s)) return e("no SOF", "Corrupt JPEG");
         m = get_marker(z);
      }
   }
   if (!process_frame_header(z, scan)) return 0;
   return 1;
}